

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

CNscPStackEntry * NscBuildPlusMinus(CNscPStackEntry *pValue,int fPlus,int fPre)

{
  size_t nSize;
  size_t *__src;
  CNwnDoubleLinkList *pCVar1;
  CNscPStackEntry *pCVar2;
  uint uVar3;
  CNscContext *pCVar4;
  CNscPStackEntry *this;
  CNwnDoubleLinkList *pCVar5;
  CNwnDoubleLinkList *pNext;
  char *pcVar6;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  pCVar4 = g_pCtx;
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pValue != (CNscPStackEntry *)0x0) {
      pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar2 = (CNscPStackEntry *)(pValue->m_link).m_pNext;
      if (pCVar2 != pValue) {
        pCVar5 = (pValue->m_link).m_pPrev;
        (pCVar2->m_link).m_pPrev = pCVar5;
        pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar2;
        (pValue->m_link).m_pNext = &pValue->m_link;
        (pValue->m_link).m_pPrev = &pValue->m_link;
      }
      pCVar5 = &pCVar4->m_listEntryFree;
      if ((CNscPStackEntry *)&pCVar4->m_listEntryFree == pValue) {
        pCVar5 = pCVar1;
      }
      pCVar1 = pCVar5->m_pNext;
      (pValue->m_link).m_pNext = pCVar1;
      (pValue->m_link).m_pPrev = pCVar5;
      pCVar5->m_pNext = &pValue->m_link;
      pCVar1->m_pPrev = &pValue->m_link;
    }
    if (this->m_nType == NscType_Unknown) {
      this->m_nType = NscType_Unknown;
      return this;
    }
    goto LAB_0014cb75;
  }
  if (pValue == (CNscPStackEntry *)0x0) {
    __assert_fail("pValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                  ,0xa2e,"CNscPStackEntry *NscBuildPlusMinus(CNscPStackEntry *, int, int)");
  }
  if (pValue->m_nType == NscType_Integer) {
    nSize = pValue->m_nDataSize;
    if ((((nSize != 0) && (__src = (size_t *)pValue->m_pauchData, *__src == nSize)) &&
        ((int)__src[1] == 0)) && ((__src[5] & 0xbc) == 0)) {
      CNscPStackEntry::MakeRoom(this,nSize);
      memcpy(this->m_pauchData + this->m_nDataSize,__src,nSize);
      this->m_nDataSize = this->m_nDataSize + nSize;
      uVar3 = (uint)(fPre == 0) * 4 + 4;
      if (fPlus == 0) {
        uVar3 = (uint)(fPre == 0) * 0x10 + 0x10;
      }
      *(uint *)(this->m_pauchData + 0x28) = *(uint *)(this->m_pauchData + 0x28) | uVar3;
      if (this->m_nType != NscType_Unknown) goto LAB_0014cb75;
      this->m_nType = NscType_Integer;
      goto LAB_0014cac6;
    }
LAB_0014ca95:
    pcVar6 = "++";
    if (fPlus == 0) {
      pcVar6 = "--";
    }
    CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorOperatorTypeMismatch,pcVar6);
  }
  else if (pValue->m_nType != NscType_Error) goto LAB_0014ca95;
  if (this->m_nType == NscType_Unknown) {
    this->m_nType = NscType_Error;
LAB_0014cac6:
    pCVar4 = g_pCtx;
    pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
    pCVar2 = (CNscPStackEntry *)(pValue->m_link).m_pNext;
    if (pCVar2 != pValue) {
      pCVar5 = (pValue->m_link).m_pPrev;
      (pCVar2->m_link).m_pPrev = pCVar5;
      pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar2;
      (pValue->m_link).m_pNext = &pValue->m_link;
      (pValue->m_link).m_pPrev = &pValue->m_link;
    }
    pCVar5 = &pCVar4->m_listEntryFree;
    if ((CNscPStackEntry *)&pCVar4->m_listEntryFree == pValue) {
      pCVar5 = pCVar1;
    }
    pCVar1 = pCVar5->m_pNext;
    (pValue->m_link).m_pNext = pCVar1;
    (pValue->m_link).m_pPrev = pCVar5;
    pCVar5->m_pNext = &pValue->m_link;
    pCVar1->m_pPrev = &pValue->m_link;
    return this;
  }
LAB_0014cb75:
  __assert_fail("m_nType == NscType_Unknown",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                ,0xee,"void CNscPStackEntry::SetType(NscType)");
}

Assistant:

YYSTYPE NscBuildPlusMinus (YYSTYPE pValue, int fPlus, int fPre)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pValue)
			g_pCtx ->FreePStackEntry (pValue);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Get the value
	//

	assert (pValue);

	//
	// Check for an error
	//

	NscType nType = pValue ->GetType ();
	if (nType == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Process the operator
	//

	else if (nType == NscType_Integer && pValue ->IsSimpleVariable ())
	{
		pOut ->AppendData (pValue);
		NscPCodeVariable *pv = (NscPCodeVariable *) pOut ->GetData ();
		if (fPlus)
			pv ->ulFlags |= fPre ? NscSymFlag_PreIncrement : NscSymFlag_PostIncrement;
		else
			pv ->ulFlags |= fPre ? NscSymFlag_PreDecrement : NscSymFlag_PostDecrement;
		pOut ->SetType (nType);
	}
	else
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, fPlus ? "++" : "--");
		pOut ->SetType (NscType_Error);
	}

	//
	// Rundown
	//

    g_pCtx ->FreePStackEntry (pValue);
	return pOut;
}